

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::StringValueScanner::StringValueScanner
          (StringValueScanner *this,idx_t scanner_idx_p,
          shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler,
          shared_ptr<duckdb::CSVFileScan,_true> *csv_file_scan,bool sniffing,CSVIterator *boundary,
          idx_t result_size)

{
  bool store_line_size_p;
  shared_ptr<duckdb::CSVFileScan,_true> csv_file_scan_p;
  string path_p;
  type state_machine_00;
  CSVBufferManager *pCVar1;
  Allocator *buffer_allocator;
  type error_hander_p;
  pointer pCVar2;
  CSVStateMachine *pCVar3;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffff18;
  idx_t buffer_position;
  __shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)buffer_manager);
  ::std::__shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,
             (__shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2> *)state_machine);
  ::std::__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             (__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> *)error_handler);
  ::std::__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10),
             (__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2> *)csv_file_scan);
  BaseScanner::BaseScanner
            (&this->super_BaseScanner,(shared_ptr<duckdb::CSVBufferManager,_true> *)&local_90,
             (shared_ptr<duckdb::CSVStateMachine,_true> *)&local_a0,
             (shared_ptr<duckdb::CSVErrorHandler,_true> *)&local_60,sniffing,
             (shared_ptr<duckdb::CSVFileScan,_true> *)(local_80 + 0x10),boundary);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)&PTR__StringValueScanner_027af158;
  this->scanner_idx = scanner_idx_p;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  state_machine_00 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(state_machine);
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  buffer_allocator = BufferAllocator::Get(pCVar1->context);
  buffer_position = (this->super_BaseScanner).iterator.pos.buffer_pos;
  error_hander_p = shared_ptr<duckdb::CSVErrorHandler,_true>::operator*(error_handler);
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  pCVar2 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator->
                     (&pCVar1->context->client_data);
  store_line_size_p = pCVar2->debug_set_max_line_length;
  ::std::__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2> *)csv_file_scan);
  pCVar1 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  uVar4 = 0x18973f6;
  CSVBufferManager::GetFilePath_abi_cxx11_(&local_50,pCVar1);
  csv_file_scan_p.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BaseScanner).lines_read;
  csv_file_scan_p.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_80;
  path_p._M_string_length = uVar4;
  path_p._M_dataplus._M_p = (pointer)scanner_idx_p;
  path_p.field_2._M_allocated_capacity = in_stack_ffffffffffffff18;
  path_p.field_2._8_8_ = error_hander_p;
  StringValueResult::StringValueResult
            (&this->result,&(this->super_BaseScanner).states,state_machine_00,
             &(this->super_BaseScanner).cur_buffer_handle,buffer_allocator,result_size,
             buffer_position,error_hander_p,&(this->super_BaseScanner).iterator,store_line_size_p,
             csv_file_scan_p,(idx_t *)(ulong)sniffing,SUB81(&local_50,0),path_p,buffer_position);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->start_pos = 0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar3 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(state_machine);
  (this->super_BaseScanner).iterator.buffer_size = (pCVar3->options->buffer_size_option).value;
  return;
}

Assistant:

StringValueScanner::StringValueScanner(idx_t scanner_idx_p, const shared_ptr<CSVBufferManager> &buffer_manager,
                                       const shared_ptr<CSVStateMachine> &state_machine,
                                       const shared_ptr<CSVErrorHandler> &error_handler,
                                       const shared_ptr<CSVFileScan> &csv_file_scan, bool sniffing,
                                       const CSVIterator &boundary, idx_t result_size)
    : BaseScanner(buffer_manager, state_machine, error_handler, sniffing, csv_file_scan, boundary),
      scanner_idx(scanner_idx_p),
      result(states, *state_machine, cur_buffer_handle, BufferAllocator::Get(buffer_manager->context), result_size,
             iterator.pos.buffer_pos, *error_handler, iterator,
             buffer_manager->context.client_data->debug_set_max_line_length, csv_file_scan, lines_read, sniffing,
             buffer_manager->GetFilePath(), scanner_idx_p),
      start_pos(0) {
	iterator.buffer_size = state_machine->options.buffer_size_option.GetValue();
}